

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.h
# Opt level: O1

double __thiscall llvm::ErrorList::log(ErrorList *this,double __x)

{
  pointer puVar1;
  double dVar2;
  raw_ostream *in_RSI;
  unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> *ErrPayload;
  pointer puVar3;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  StringRef Str;
  StringRef Str_00;
  
  Str.Length = 0x11;
  Str.Data = "Multiple errors:\n";
  raw_ostream::operator<<(in_RSI,Str);
  puVar1 = (this->Payloads).
           super__Vector_base<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>,_std::allocator<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  dVar2 = extraout_XMM0_Qa;
  for (puVar3 = (this->Payloads).
                super__Vector_base<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>,_std::allocator<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar3 != puVar1; puVar3 = puVar3 + 1) {
    (*((puVar3->_M_t).
       super___uniq_ptr_impl<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>._M_t.
       super__Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>.
       super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl)->_vptr_ErrorInfoBase[2])();
    Str_00.Length = 1;
    Str_00.Data = "\n";
    raw_ostream::operator<<(in_RSI,Str_00);
    dVar2 = extraout_XMM0_Qa_00;
  }
  return dVar2;
}

Assistant:

void log(raw_ostream &OS) const override {
    OS << "Multiple errors:\n";
    for (auto &ErrPayload : Payloads) {
      ErrPayload->log(OS);
      OS << "\n";
    }
  }